

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_finish_entry(archive_write *a)

{
  uint16_t uVar1;
  int iVar2;
  uchar *__dest;
  uint32_t local_d8;
  uint32_t local_c8;
  uint32_t local_b8;
  uchar *zd;
  uchar *z;
  uchar zip64 [32];
  char d [24];
  size_t hmac_len;
  uint8_t hmac [20];
  size_t local_38;
  size_t outl;
  size_t remainder;
  zip_conflict *pzStack_20;
  int ret;
  zip_conflict *zip;
  archive_write *a_local;
  
  pzStack_20 = (zip_conflict *)a->format_data;
  zip = (zip_conflict *)a;
  if (pzStack_20->entry_compression == COMPRESSION_DEFLATE) {
    while (remainder._4_4_ = cm_zlib_deflate((z_streamp)&pzStack_20->stream,4),
          remainder._4_4_ != -2) {
      outl = pzStack_20->len_buf - (ulong)(pzStack_20->stream).avail_out;
      if (pzStack_20->tctx_valid == '\0') {
        if (pzStack_20->cctx_valid != '\0') {
          local_38 = outl;
          remainder._4_4_ =
               aes_ctr_update(&pzStack_20->cctx,pzStack_20->buf,outl,pzStack_20->buf,&local_38);
          if (remainder._4_4_ < 0) {
            archive_set_error((archive *)zip,-1,"Failed to encrypt file");
            return -0x19;
          }
          __hmac_sha1_update(&pzStack_20->hctx,pzStack_20->buf,outl);
        }
      }
      else {
        trad_enc_encrypt_update(&pzStack_20->tctx,pzStack_20->buf,outl,pzStack_20->buf,outl);
      }
      remainder._4_4_ = __archive_write_output((archive_write *)zip,pzStack_20->buf,outl);
      if (remainder._4_4_ != 0) {
        return remainder._4_4_;
      }
      pzStack_20->entry_compressed_written = outl + pzStack_20->entry_compressed_written;
      pzStack_20->written_bytes = outl + pzStack_20->written_bytes;
      (pzStack_20->stream).next_out = pzStack_20->buf;
      if ((pzStack_20->stream).avail_out != 0) {
        cm_zlib_deflateEnd((z_streamp)&pzStack_20->stream);
        goto LAB_0083315c;
      }
      (pzStack_20->stream).avail_out = (uInt)pzStack_20->len_buf;
      remainder._4_4_ = 0;
    }
    a_local._4_4_ = -0x1e;
  }
  else {
LAB_0083315c:
    if (pzStack_20->hctx_valid != '\0') {
      d[0x10] = '\x14';
      d[0x11] = '\0';
      d[0x12] = '\0';
      d[0x13] = '\0';
      d[0x14] = '\0';
      d[0x15] = '\0';
      d[0x16] = '\0';
      d[0x17] = '\0';
      __hmac_sha1_final(&pzStack_20->hctx,(uint8_t *)&hmac_len,(size_t *)(d + 0x10));
      iVar2 = __archive_write_output((archive_write *)zip,&hmac_len,10);
      if (iVar2 != 0) {
        return iVar2;
      }
      pzStack_20->entry_compressed_written = pzStack_20->entry_compressed_written + 10;
      pzStack_20->written_bytes = pzStack_20->written_bytes + 10;
      remainder._4_4_ = 0;
    }
    if ((pzStack_20->entry_flags & 8U) != 0) {
      builtin_memcpy(zip64 + 0x18,"PK\a\b",4);
      if ((pzStack_20->cctx_valid == '\0') || (pzStack_20->aes_vendor != 2)) {
        archive_le32enc(zip64 + 0x1c,pzStack_20->entry_crc32);
      }
      else {
        archive_le32enc(zip64 + 0x1c,0);
      }
      if (pzStack_20->entry_uses_zip64 == 0) {
        archive_le32enc(d,(uint32_t)pzStack_20->entry_compressed_written);
        archive_le32enc(d + 4,(uint32_t)pzStack_20->entry_uncompressed_written);
        remainder._4_4_ = __archive_write_output((archive_write *)zip,zip64 + 0x18,0x10);
        pzStack_20->written_bytes = pzStack_20->written_bytes + 0x10;
      }
      else {
        archive_le64enc(d,pzStack_20->entry_compressed_written);
        archive_le64enc(d + 8,pzStack_20->entry_uncompressed_written);
        remainder._4_4_ = __archive_write_output((archive_write *)zip,zip64 + 0x18,0x18);
        pzStack_20->written_bytes = pzStack_20->written_bytes + 0x18;
      }
      if (remainder._4_4_ != 0) {
        return -0x1e;
      }
    }
    if (((0xffffffff < pzStack_20->entry_compressed_written) ||
        (0xffffffff < pzStack_20->entry_uncompressed_written)) ||
       (0xffffffff < pzStack_20->entry_offset)) {
      z._0_4_ = 1;
      zd = (uchar *)((long)&z + 4);
      if (0xfffffffe < pzStack_20->entry_uncompressed_written) {
        archive_le64enc(zd,pzStack_20->entry_uncompressed_written);
        zd = zip64 + 4;
      }
      if (0xfffffffe < pzStack_20->entry_compressed_written) {
        archive_le64enc(zd,pzStack_20->entry_compressed_written);
        zd = zd + 8;
      }
      if (0xfffffffe < pzStack_20->entry_offset) {
        archive_le64enc(zd,pzStack_20->entry_offset);
        zd = zd + 8;
      }
      archive_le16enc((void *)((long)&z + 2),(short)zd - ((short)&z + 4));
      __dest = cd_alloc(pzStack_20,(long)zd - (long)&z);
      if (__dest == (uchar *)0x0) {
        archive_set_error((archive *)zip,0xc,"Can\'t allocate zip data");
        return -0x1e;
      }
      memcpy(__dest,&z,(long)zd - (long)&z);
      uVar1 = archive_le16dec(pzStack_20->file_header + 6);
      if (uVar1 < 0x2d) {
        archive_le16enc(pzStack_20->file_header + 6,0x2d);
      }
    }
    if ((pzStack_20->cctx_valid == '\0') || (pzStack_20->aes_vendor != 2)) {
      archive_le32enc(pzStack_20->file_header + 0x10,pzStack_20->entry_crc32);
    }
    else {
      archive_le32enc(pzStack_20->file_header + 0x10,0);
    }
    if (pzStack_20->entry_compressed_written < 0x100000000) {
      local_b8 = (uint32_t)pzStack_20->entry_compressed_written;
    }
    else {
      local_b8 = 0xffffffff;
    }
    archive_le32enc(pzStack_20->file_header + 0x14,local_b8);
    if (pzStack_20->entry_uncompressed_written < 0x100000000) {
      local_c8 = (uint32_t)pzStack_20->entry_uncompressed_written;
    }
    else {
      local_c8 = 0xffffffff;
    }
    archive_le32enc(pzStack_20->file_header + 0x18,local_c8);
    archive_le16enc(pzStack_20->file_header + 0x1e,
                    (short)pzStack_20->central_directory_bytes -
                    (short)pzStack_20->file_header_extra_offset);
    if (pzStack_20->entry_offset < 0x100000000) {
      local_d8 = (uint32_t)pzStack_20->entry_offset;
    }
    else {
      local_d8 = 0xffffffff;
    }
    archive_le32enc(pzStack_20->file_header + 0x2a,local_d8);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;

#if HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		for (;;) {
			size_t remainder;

			ret = deflate(&zip->stream, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.next_out = zip->buf;
			if (zip->stream.avail_out != 0)
				break;
			zip->stream.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream);
	}
#endif
	if (zip->hctx_valid) {
		uint8_t hmac[20];
		size_t hmac_len = 20;

		archive_hmac_sha1_final(&zip->hctx, hmac, &hmac_len);
		ret = __archive_write_output(a, hmac, AUTH_CODE_SIZE);
		if (ret != ARCHIVE_OK)
			return (ret);
		zip->entry_compressed_written += AUTH_CODE_SIZE;
		zip->written_bytes += AUTH_CODE_SIZE;
	}

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
			archive_le32enc(d + 4, 0);/* no CRC.*/
		else
			archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_uses_zip64) {
			archive_le64enc(d + 8,
				(uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16,
				(uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8,
				(uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12,
				(uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Append Zip64 extra data to central directory information. */
	if (zip->entry_compressed_written > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->entry_uncompressed_written > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->entry_offset > ARCHIVE_LITERAL_LL(0xffffffff)) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, (uint16_t)(z - (zip64 + 4)));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
		(uint32_t)zipmin(zip->entry_compressed_written,
				 ARCHIVE_LITERAL_LL(0xffffffff)));
	archive_le32enc(zip->file_header + 24,
		(uint32_t)zipmin(zip->entry_uncompressed_written,
				 ARCHIVE_LITERAL_LL(0xffffffff)));
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42,
		(uint32_t)zipmin(zip->entry_offset,
				 ARCHIVE_LITERAL_LL(0xffffffff)));

	return (ARCHIVE_OK);
}